

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O0

unsigned_long compute_checksum(CVmFile *fp,unsigned_long len)

{
  unsigned_long uVar1;
  ulong in_RSI;
  size_t cur_len;
  char buf [256];
  CVmCRC32 crc;
  size_t buflen;
  char *in_stack_fffffffffffffee8;
  CVmFile *in_stack_fffffffffffffef0;
  CVmCRC32 local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  CVmCRC32::CVmCRC32(&local_18);
  while (local_10 != 0) {
    buflen = 0x100;
    if (local_10 < 0x100) {
      buflen = local_10;
    }
    CVmFile::read_bytes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,buflen);
    local_10 = local_10 - buflen;
    CVmCRC32::scan_bytes(&local_18,&stack0xfffffffffffffee8,buflen);
  }
  uVar1 = CVmCRC32::get_crc_val(&local_18);
  return uVar1;
}

Assistant:

static unsigned long compute_checksum(CVmFile *fp, unsigned long len)
{
    CVmCRC32 crc;

    /* read the file and compute the CRC value for its contents */
    while (len != 0)
    {
        char buf[256];
        size_t cur_len;
        
        /* figure out how much we can load from the file */
        cur_len = sizeof(buf);
        if (cur_len > len)
            cur_len = (size_t)len;

        /* load the data from the file */
        fp->read_bytes(buf, cur_len);

        /* deduct the amount we read from the overall file length remaining */
        len -= cur_len;

        /* scan this block into the checksum */
        crc.scan_bytes(buf, cur_len);
    }

    /* return the computed value */
    return crc.get_crc_val();
}